

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to1.h
# Opt level: O3

void ncnn::conv3x3s1_pack8to1_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  void *pvVar16;
  ulong uVar17;
  size_t sVar18;
  size_t sVar19;
  void *pvVar20;
  void *pvVar21;
  float fVar22;
  undefined1 auVar23 [16];
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  undefined1 (*pauVar30) [32];
  long lVar31;
  void *pvVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  void *pvVar42;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar43 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  float fVar51;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar52 [64];
  undefined1 auVar59 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 in_ZMM5 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  int size;
  undefined1 auVar60 [64];
  
  iVar12 = top_blob->c;
  if (0 < (long)iVar12) {
    iVar13 = top_blob->w;
    uVar14 = top_blob->h;
    uVar15 = bottom_blob->c;
    pvVar16 = top_blob->data;
    uVar17 = top_blob->elemsize;
    lVar28 = top_blob->cstep * uVar17;
    lVar41 = 0;
    iVar38 = (int)((uVar17 * (long)(int)uVar14 * (long)iVar13 + 0xf & 0xfffffffffffffff0) / uVar17);
    if (top_blob->dims == 4) {
      iVar38 = (int)((long)(int)uVar14 * (long)iVar13);
    }
    uVar25 = iVar38 * top_blob->d;
    sVar18 = kernel->cstep;
    sVar19 = kernel->elemsize;
    pvVar20 = kernel->data;
    pvVar21 = bottom_blob->data;
    lVar29 = bottom_blob->cstep * bottom_blob->elemsize;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = (ulong)uVar25 - 1;
    auVar23 = vpshufd_avx(auVar43,0x44);
    lVar36 = (long)bottom_blob->w * bottom_blob->elemsize;
    auVar50 = ZEXT3264(_DAT_00517040);
    auVar52 = ZEXT3264(_DAT_00517060);
    uVar17 = auVar23._0_8_;
    auVar59._0_8_ = uVar17 ^ 0x8000000000000000;
    auVar59._8_4_ = auVar23._8_4_;
    uVar24 = auVar23._12_4_;
    auVar59._12_4_ = uVar24 ^ 0x80000000;
    auVar43 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
    pvVar32 = pvVar16;
    do {
      auVar63 = ZEXT1664(auVar43);
      auVar60 = ZEXT1664(auVar59);
      auVar47 = ZEXT3264(CONCAT1616(auVar23,auVar23));
      if (_bias == (Mat *)0x0) {
        auVar66 = ZEXT816(0) << 0x40;
      }
      else {
        auVar66 = ZEXT416(*(uint *)((long)&_bias->data + lVar41 * 4));
      }
      if (0 < (int)uVar25) {
        auVar66 = vshufps_avx(auVar66,auVar66,0);
        auVar67._16_16_ = auVar66;
        auVar67._0_16_ = auVar66;
        uVar26 = 0;
        do {
          auVar66._8_8_ = 0;
          auVar66._0_8_ = uVar26;
          auVar66 = vpshufd_avx(auVar66,0x44);
          auVar69._16_16_ = auVar66;
          auVar69._0_16_ = auVar66;
          auVar70 = vorps_avx(auVar69,auVar50._0_32_);
          auVar69 = vorps_avx(auVar69,auVar52._0_32_);
          auVar72._0_8_ = auVar69._16_8_ ^ 0x8000000000000000;
          auVar72._8_4_ = auVar69._24_4_;
          auVar72._12_4_ = auVar69._28_4_ ^ 0x80000000;
          auVar66 = vpcmpgtq_avx(auVar72,auVar59);
          auVar74._0_8_ = uVar17 ^ 0x8000000000000000;
          auVar74._8_4_ = auVar59._8_4_;
          auVar74._12_4_ = uVar24 ^ 0x80000000;
          auVar68._0_8_ = auVar69._0_8_ ^ 0x8000000000000000;
          auVar68._8_4_ = auVar69._8_4_;
          auVar68._12_4_ = auVar69._12_4_ ^ 0x80000000;
          auVar68 = vpcmpgtq_avx(auVar68,auVar74);
          auVar66 = vpackssdw_avx(auVar68,auVar66);
          auVar73._0_8_ = auVar70._16_8_ ^ 0x8000000000000000;
          auVar73._8_4_ = auVar70._24_4_;
          auVar73._12_4_ = auVar70._28_4_ ^ 0x80000000;
          auVar68 = vpcmpgtq_avx(auVar73,auVar59);
          auVar75._0_8_ = uVar17 ^ 0x8000000000000000;
          auVar75._8_4_ = auVar59._8_4_;
          auVar75._12_4_ = uVar24 ^ 0x80000000;
          auVar71._0_8_ = auVar70._0_8_ ^ 0x8000000000000000;
          auVar71._8_4_ = auVar70._8_4_;
          auVar71._12_4_ = auVar70._12_4_ ^ 0x80000000;
          auVar71 = vpcmpgtq_avx(auVar71,auVar75);
          auVar68 = vpackssdw_avx(auVar71,auVar68);
          auVar66 = vpackssdw_avx(auVar68 ^ auVar43,auVar66 ^ auVar43);
          auVar68 = vpmovsxwd_avx(auVar66);
          auVar66 = vpunpckhwd_avx(auVar66,auVar66);
          auVar70._16_16_ = auVar66;
          auVar70._0_16_ = auVar68;
          auVar70 = vmaskmovps_avx(auVar70,auVar67);
          *(undefined1 (*) [32])((long)pvVar32 + uVar26 * 4) = auVar70;
          uVar26 = uVar26 + 8;
        } while ((uVar25 + 7 & 0xfffffff8) != uVar26);
      }
      if (0 < (int)uVar15) {
        pauVar30 = (undefined1 (*) [32])(sVar18 * sVar19 * lVar41 + (long)pvVar20);
        uVar26 = 0;
        lVar31 = (long)pvVar21 + lVar36 + 0x40;
        lVar35 = (long)pvVar21 + lVar36 * 2 + 0x40;
        lVar39 = (long)pvVar21 + 0x40;
        do {
          if (0 < (int)uVar14) {
            auVar67 = *pauVar30;
            auVar70 = pauVar30[1];
            auVar69 = pauVar30[2];
            auVar6 = pauVar30[3];
            auVar7 = pauVar30[4];
            auVar8 = pauVar30[5];
            auVar9 = pauVar30[6];
            auVar10 = pauVar30[7];
            auVar11 = pauVar30[8];
            uVar27 = 0;
            lVar34 = lVar35;
            lVar37 = lVar31;
            lVar40 = lVar39;
            pvVar42 = (void *)(lVar28 * lVar41 + (long)pvVar16);
            do {
              if (0 < iVar13) {
                lVar33 = 0;
                auVar61 = auVar60;
                auVar64 = auVar63;
                iVar38 = iVar13;
                do {
                  pfVar2 = (float *)(lVar40 + -0x40 + lVar33 * 8);
                  pfVar3 = (float *)(lVar40 + -0x20 + lVar33 * 8);
                  pfVar1 = (float *)(lVar40 + lVar33 * 8);
                  auVar65._0_4_ = auVar69._0_4_ * *pfVar1;
                  auVar65._4_4_ = auVar69._4_4_ * pfVar1[1];
                  auVar65._8_4_ = auVar69._8_4_ * pfVar1[2];
                  auVar65._12_4_ = auVar69._12_4_ * pfVar1[3];
                  auVar65._16_4_ = auVar69._16_4_ * pfVar1[4];
                  auVar65._20_4_ = auVar69._20_4_ * pfVar1[5];
                  auVar65._28_36_ = auVar64._28_36_;
                  auVar65._24_4_ = auVar69._24_4_ * pfVar1[6];
                  auVar63 = ZEXT3264(auVar65._0_32_);
                  pfVar4 = (float *)(lVar37 + -0x40 + lVar33 * 8);
                  pfVar5 = (float *)(lVar37 + -0x20 + lVar33 * 8);
                  pfVar1 = (float *)(lVar37 + lVar33 * 8);
                  auVar62._0_4_ = auVar8._0_4_ * *pfVar1;
                  auVar62._4_4_ = auVar8._4_4_ * pfVar1[1];
                  auVar62._8_4_ = auVar8._8_4_ * pfVar1[2];
                  auVar62._12_4_ = auVar8._12_4_ * pfVar1[3];
                  auVar62._16_4_ = auVar8._16_4_ * pfVar1[4];
                  auVar62._20_4_ = auVar8._20_4_ * pfVar1[5];
                  auVar62._28_36_ = auVar61._28_36_;
                  auVar62._24_4_ = auVar8._24_4_ * pfVar1[6];
                  auVar60 = ZEXT3264(auVar62._0_32_);
                  pfVar1 = (float *)(lVar34 + -0x40 + lVar33 * 8);
                  fVar22 = auVar52._28_4_;
                  auVar46._0_4_ =
                       auVar6._0_4_ * *pfVar4 + auVar67._0_4_ * *pfVar2 + auVar9._0_4_ * *pfVar1;
                  auVar46._4_4_ =
                       auVar6._4_4_ * pfVar4[1] + auVar67._4_4_ * pfVar2[1] +
                       auVar9._4_4_ * pfVar1[1];
                  auVar46._8_4_ =
                       auVar6._8_4_ * pfVar4[2] + auVar67._8_4_ * pfVar2[2] +
                       auVar9._8_4_ * pfVar1[2];
                  auVar46._12_4_ =
                       auVar6._12_4_ * pfVar4[3] + auVar67._12_4_ * pfVar2[3] +
                       auVar9._12_4_ * pfVar1[3];
                  auVar46._16_4_ =
                       auVar6._16_4_ * pfVar4[4] + auVar67._16_4_ * pfVar2[4] +
                       auVar9._16_4_ * pfVar1[4];
                  auVar46._20_4_ =
                       auVar6._20_4_ * pfVar4[5] + auVar67._20_4_ * pfVar2[5] +
                       auVar9._20_4_ * pfVar1[5];
                  auVar46._24_4_ =
                       auVar6._24_4_ * pfVar4[6] + auVar67._24_4_ * pfVar2[6] +
                       auVar9._24_4_ * pfVar1[6];
                  auVar46._28_4_ = auVar47._28_4_ + auVar50._28_4_ + 0.0;
                  pfVar1 = (float *)(lVar34 + -0x20 + lVar33 * 8);
                  auVar48._0_4_ =
                       auVar7._0_4_ * *pfVar5 + auVar70._0_4_ * *pfVar3 + auVar10._0_4_ * *pfVar1;
                  auVar48._4_4_ =
                       auVar7._4_4_ * pfVar5[1] + auVar70._4_4_ * pfVar3[1] +
                       auVar10._4_4_ * pfVar1[1];
                  auVar48._8_4_ =
                       auVar7._8_4_ * pfVar5[2] + auVar70._8_4_ * pfVar3[2] +
                       auVar10._8_4_ * pfVar1[2];
                  auVar48._12_4_ =
                       auVar7._12_4_ * pfVar5[3] + auVar70._12_4_ * pfVar3[3] +
                       auVar10._12_4_ * pfVar1[3];
                  auVar48._16_4_ =
                       auVar7._16_4_ * pfVar5[4] + auVar70._16_4_ * pfVar3[4] +
                       auVar10._16_4_ * pfVar1[4];
                  auVar48._20_4_ =
                       auVar7._20_4_ * pfVar5[5] + auVar70._20_4_ * pfVar3[5] +
                       auVar10._20_4_ * pfVar1[5];
                  auVar48._24_4_ =
                       auVar7._24_4_ * pfVar5[6] + auVar70._24_4_ * pfVar3[6] +
                       auVar10._24_4_ * pfVar1[6];
                  auVar48._28_4_ = auVar50._28_4_ + fVar22 + fVar22;
                  auVar46 = vhaddps_avx(auVar46,auVar48);
                  pfVar1 = (float *)(lVar34 + lVar33 * 8);
                  fVar51 = auVar11._0_4_ * *pfVar1;
                  fVar53 = auVar11._4_4_ * pfVar1[1];
                  fVar54 = auVar11._8_4_ * pfVar1[2];
                  fVar55 = auVar11._12_4_ * pfVar1[3];
                  fVar56 = auVar11._16_4_ * pfVar1[4];
                  fVar57 = auVar11._20_4_ * pfVar1[5];
                  fVar58 = auVar11._24_4_ * pfVar1[6];
                  auVar52 = ZEXT3264(CONCAT428(fVar22,CONCAT424(fVar58,CONCAT420(fVar57,CONCAT416(
                                                  fVar56,CONCAT412(fVar55,CONCAT48(fVar54,CONCAT44(
                                                  fVar53,fVar51))))))));
                  auVar49._0_4_ = auVar62._0_4_ + auVar65._0_4_ + fVar51;
                  auVar49._4_4_ = auVar62._4_4_ + auVar65._4_4_ + fVar53;
                  auVar49._8_4_ = auVar62._8_4_ + auVar65._8_4_ + fVar54;
                  auVar49._12_4_ = auVar62._12_4_ + auVar65._12_4_ + fVar55;
                  auVar49._16_4_ = auVar62._16_4_ + auVar65._16_4_ + fVar56;
                  auVar49._20_4_ = auVar62._20_4_ + auVar65._20_4_ + fVar57;
                  auVar49._24_4_ = auVar62._24_4_ + auVar65._24_4_ + fVar58;
                  auVar49._28_4_ = auVar61._28_4_ + auVar64._28_4_ + fVar22;
                  auVar48 = vhaddps_avx(auVar49,ZEXT1632(ZEXT816(0) << 0x40));
                  auVar46 = vhaddps_avx(auVar46,auVar48);
                  auVar44._0_4_ = auVar46._16_4_ + auVar46._0_4_;
                  auVar44._4_4_ = auVar46._20_4_ + auVar46._4_4_;
                  auVar44._8_4_ = auVar46._24_4_ + auVar46._8_4_;
                  auVar44._12_4_ = auVar46._28_4_ + auVar46._12_4_;
                  auVar43 = vshufpd_avx(auVar44,auVar44,1);
                  auVar45._0_4_ = auVar43._0_4_ + auVar44._0_4_;
                  auVar45._4_4_ = auVar43._4_4_ + auVar44._4_4_;
                  auVar45._8_4_ = auVar43._8_4_ + auVar44._8_4_;
                  auVar45._12_4_ = auVar43._12_4_ + auVar44._12_4_;
                  auVar43 = vmovshdup_avx(auVar45);
                  fVar22 = auVar43._0_4_ + *(float *)((long)pvVar42 + lVar33);
                  auVar50 = ZEXT464((uint)fVar22);
                  fVar22 = fVar22 + auVar45._0_4_;
                  auVar47 = ZEXT464((uint)fVar22);
                  *(float *)((long)pvVar42 + lVar33) = fVar22;
                  lVar33 = lVar33 + 4;
                  iVar38 = iVar38 + -1;
                  auVar61 = auVar60;
                  auVar64 = auVar63;
                } while (iVar38 != 0);
                pvVar42 = (void *)((long)pvVar42 + lVar33);
              }
              uVar27 = uVar27 + 1;
              lVar40 = lVar40 + lVar36;
              lVar37 = lVar37 + lVar36;
              lVar34 = lVar34 + lVar36;
            } while (uVar27 != uVar14);
          }
          auVar43 = auVar63._0_16_;
          pauVar30 = pauVar30 + 9;
          uVar26 = uVar26 + 1;
          lVar39 = lVar39 + lVar29;
          lVar31 = lVar31 + lVar29;
          lVar35 = lVar35 + lVar29;
        } while (uVar26 != uVar15);
      }
      lVar41 = lVar41 + 1;
      pvVar32 = (void *)((long)pvVar32 + lVar28);
      auVar50 = ZEXT3264(_DAT_00517040);
      auVar52 = ZEXT3264(_DAT_00517060);
      auVar43 = vpcmpeqd_avx(auVar43,auVar43);
    } while (lVar41 != iVar12);
  }
  return;
}

Assistant:

static void conv3x3s1_pack8to1_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    int remain_outch_start = 0;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;
        out0.fill(bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            __m256 _k00 = _mm256_loadu_ps(k0);
            __m256 _k01 = _mm256_loadu_ps(k0 + 8);
            __m256 _k02 = _mm256_loadu_ps(k0 + 16);
            __m256 _k10 = _mm256_loadu_ps(k0 + 24);
            __m256 _k11 = _mm256_loadu_ps(k0 + 32);
            __m256 _k12 = _mm256_loadu_ps(k0 + 40);
            __m256 _k20 = _mm256_loadu_ps(k0 + 48);
            __m256 _k21 = _mm256_loadu_ps(k0 + 56);
            __m256 _k22 = _mm256_loadu_ps(k0 + 64);

            int i = 0;

            for (; i < outh; i++)
            {
                const float* r0 = img0.row(i);
                const float* r1 = img0.row(i + 1);
                const float* r2 = img0.row(i + 2);
                int j = 0;
                for (; j < outw; j++)
                {
                    __m256 _r00 = _mm256_loadu_ps(r0);
                    __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                    __m256 _r02 = _mm256_loadu_ps(r0 + 16);

                    __m256 _sum0 = _mm256_mul_ps(_k00, _r00);
                    __m256 _sum1 = _mm256_mul_ps(_k01, _r01);
                    __m256 _sum2 = _mm256_mul_ps(_k02, _r02);

                    __m256 _r10 = _mm256_loadu_ps(r1);
                    __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                    __m256 _r12 = _mm256_loadu_ps(r1 + 16);

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum2 = _mm256_comp_fmadd_ps(_k12, _r12, _sum2);

                    __m256 _r20 = _mm256_loadu_ps(r2);
                    __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                    __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                    _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_k21, _r21, _sum1);
                    _sum2 = _mm256_comp_fmadd_ps(_k22, _r22, _sum2);
                    __m128 _sum = HorizontalSums(_sum0, _sum1, _sum2);

                    *outptr0 += _mm_reduce_add_ps(_sum); // dot
                    outptr0++;
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                }
            }

            k0 += 9 * 8;
        }
    }
}